

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract(defV *data,string *val)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *this;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__str;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  ulong *puVar6;
  helics *phVar7;
  uint *puVar8;
  ulong uVar9;
  NamedPoint *point;
  vector<double,_std::allocator<double>_> *val_00;
  undefined8 extraout_RDX;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_01;
  string *this_00;
  uint __len;
  ulong __val;
  complex<double> val_02;
  string local_50;
  
  puVar8 = &switchD_00204bf9::switchdataD_003dcf28;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar5 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f",*pvVar5);
    break;
  case '\x01':
    puVar6 = (ulong *)std::
                      get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                                (data);
    uVar1 = *puVar6;
    __val = -uVar1;
    if (0 < (long)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = __val;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00204d7e;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00204d7e;
        }
        if (uVar9 < 10000) goto LAB_00204d7e;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_00204d7e:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,(ulong)(__len - (int)((long)uVar1 >> 0x3f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p + -((long)uVar1 >> 0x3f),__len,__val);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (val,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    goto LAB_00204c37;
  default:
    __str = std::
            get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                      (data);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (val,__str);
    return;
  case '\x03':
    this_00 = val;
    std::
    get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              (data);
    val_02._M_value._8_8_ = puVar8;
    val_02._M_value._0_8_ = extraout_RDX;
    helicsComplexString_abi_cxx11_(&local_50,(helics *)this_00,val_02);
    break;
  case '\x04':
    phVar7 = (helics *)
             std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    helicsVectorString_abi_cxx11_(&local_50,phVar7,val_00);
    break;
  case '\x05':
    phVar7 = (helics *)
             std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    helicsComplexVectorString_abi_cxx11_(&local_50,phVar7,val_01);
    break;
  case '\x06':
    this = std::
           get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     (data);
    if (NAN(this->value)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (this->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (this->name)._M_string_length);
    }
    else {
      helicsNamedPointString_abi_cxx11_(&local_50,(helics *)this,point);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (val,&local_50);
    goto LAB_00204c32;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (val,&local_50);
LAB_00204c32:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00204c37:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::string& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::to_string(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val = std::to_string(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        default:
            val = std::get<std::string>(data);
            break;
        case complex_loc:  // complex
            val = helicsComplexString(std::get<std::complex<double>>(data));
            break;
        case vector_loc:  // vector
            val = helicsVectorString(std::get<std::vector<double>>(data));
            break;
        case complex_vector_loc:  // vector
            val = helicsComplexVectorString(std::get<std::vector<std::complex<double>>>(data));
            break;
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            val = (std::isnan(point.value)) ? point.name : helicsNamedPointString(point);
            break;
        }
    }
}